

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

void helper_neon_qunzip32_aarch64(void *vd,void *vm)

{
  uint64_t m1;
  uint64_t m0;
  uint64_t d1;
  uint64_t d0;
  uint64_t zm1;
  uint64_t zm0;
  uint64_t zd1;
  uint64_t zd0;
  uint64_t *rm;
  uint64_t *rd;
  void *vm_local;
  void *vd_local;
  
  *(ulong *)vm = *vd >> 0x20 | *(ulong *)((long)vd + 8) & 0xffffffff00000000;
  *(ulong *)((long)vm + 8) = *vm >> 0x20 | *(ulong *)((long)vm + 8) & 0xffffffff00000000;
  *(ulong *)vd = *vd & 0xffffffff | *(ulong *)((long)vd + 8) << 0x20;
  *(ulong *)((long)vd + 8) = *vm & 0xffffffff | *(ulong *)((long)vm + 8) << 0x20;
  return;
}

Assistant:

void HELPER(neon_qunzip32)(void *vd, void *vm)
{
    uint64_t *rd = vd, *rm = vm;
    uint64_t zd0 = rd[0], zd1 = rd[1];
    uint64_t zm0 = rm[0], zm1 = rm[1];

    uint64_t d0 = ELEM(zd0, 0, 32) | (ELEM(zd1, 0, 32) << 32);
    uint64_t d1 = ELEM(zm0, 0, 32) | (ELEM(zm1, 0, 32) << 32);
    uint64_t m0 = ELEM(zd0, 1, 32) | (ELEM(zd1, 1, 32) << 32);
    uint64_t m1 = ELEM(zm0, 1, 32) | (ELEM(zm1, 1, 32) << 32);

    rm[0] = m0;
    rm[1] = m1;
    rd[0] = d0;
    rd[1] = d1;
}